

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O0

void __thiscall
ktx::ValidationContextStdioStream::ValidationContextStdioStream
          (ValidationContextStdioStream *this,bool warningsAsErrors,bool GLTFBasisU,
          function<void_(const_ktx::ValidationReport_&)> *callback,FILE *file,string *filepath)

{
  bool warningsAsErrors_00;
  bool GLTFBasisU_00;
  function<void_(const_ktx::ValidationReport_&)> *in_RCX;
  byte in_DL;
  byte in_SIL;
  ValidationContext *in_RDI;
  _func_int **in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000050;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000058;
  IssueFatal *in_stack_00000060;
  ValidationContext *in_stack_00000068;
  function<void_(const_ktx::ValidationReport_&)> *in_stack_ffffffffffffff68;
  string local_68 [72];
  _func_int **local_20;
  byte local_a;
  byte local_9;
  
  GLTFBasisU_00 = (bool)(in_SIL & 1);
  warningsAsErrors_00 = (bool)(in_DL & 1);
  local_20 = in_R8;
  local_a = warningsAsErrors_00;
  local_9 = GLTFBasisU_00;
  std::function<void_(const_ktx::ValidationReport_&)>::function(in_RCX,in_stack_ffffffffffffff68);
  ValidationContext::ValidationContext(in_RDI,warningsAsErrors_00,GLTFBasisU_00,in_RCX);
  std::function<void_(const_ktx::ValidationReport_&)>::~function
            ((function<void_(const_ktx::ValidationReport_&)> *)0x2bf2eb);
  in_RDI->_vptr_ValidationContext = (_func_int **)&PTR__ValidationContextStdioStream_00431b28;
  in_RDI[1]._vptr_ValidationContext = local_20;
  if (local_20 == (_func_int **)0x0) {
    errnoMessage_abi_cxx11_();
    ValidationContext::fatal<std::__cxx11::string_const&,std::__cxx11::string>
              (in_stack_00000068,in_stack_00000060,in_stack_00000058,in_stack_00000050);
    std::__cxx11::string::~string(local_68);
  }
  return;
}

Assistant:

ValidationContextStdioStream(bool warningsAsErrors, bool GLTFBasisU, std::function<void(const ValidationReport&)> callback, FILE* file, const std::string& filepath) :
        ValidationContext(warningsAsErrors, GLTFBasisU, std::move(callback)),
        file(file) {

        if (!file)
            fatal(IOError::FileOpen, filepath, errnoMessage());
    }